

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O1

const_iterator __thiscall
mapbox::eternal::impl::
map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_57UL>
::find(map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_57UL>
       *this,key_type *key)

{
  element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *right;
  bool bVar1;
  element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *peVar2;
  compare_key_type compare_key;
  compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_> local_28;
  
  local_28.super_compare_key<mapbox::eternal::string>.key.data_ = (string)key->data_;
  local_28.hash =
       str_hash((char *)local_28.super_compare_key<mapbox::eternal::string>.key.data_,
                0xcbf29ce484222325);
  right = this[1].data_;
  peVar2 = bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element_hash<mapbox::eternal::string,unsigned_int,std::hash<mapbox::eternal::string>>const*,mapbox::eternal::impl::compare_key_hash<mapbox::eternal::string,std::hash<mapbox::eternal::string>>>
                     (this->data_,right,&local_28);
  if (((peVar2 == right) || (local_28.hash < peVar2->hash)) ||
     ((local_28.hash <= peVar2->hash &&
      (bVar1 = str_less((char *)local_28.super_compare_key<mapbox::eternal::string>.key.data_,
                        (peVar2->super_element<mapbox::eternal::string,_unsigned_int>).pair.first.
                        data_), bVar1)))) {
    peVar2 = right;
  }
  return (const_iterator)peVar2;
}

Assistant:

find(const key_type& key) const noexcept {
        const compare_key_type compare_key{ key };
        auto it = bound<less>(data_, data_ + N, compare_key);
        if (it != data_ + N && greater_equal()(*it, compare_key)) {
            return it;
        } else {
            return end();
        }
    }